

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelPackage.cpp
# Opt level: O3

shared_ptr<MPL::ModelPackageItemInfo> __thiscall
MPL::detail::ModelPackageImpl::findItem(ModelPackageImpl *this,string *identifier)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  unique_ptr<JsonMap,_std::default_delete<JsonMap>_> uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<MPL::ModelPackageItemInfo> sVar4;
  undefined1 local_e9;
  unique_ptr<JsonMap,_std::default_delete<JsonMap>_> itemInfoEntry;
  string description;
  string author;
  string local_a0;
  string name;
  path path;
  
  getItemInfoEntry((ModelPackageImpl *)&itemInfoEntry,identifier);
  uVar3 = itemInfoEntry;
  if ((__uniq_ptr_impl<JsonMap,_std::default_delete<JsonMap>_>)
      itemInfoEntry._M_t.super___uniq_ptr_impl<JsonMap,_std::default_delete<JsonMap>_>._M_t.
      super__Tuple_impl<0UL,_JsonMap_*,_std::default_delete<JsonMap>_>.
      super__Head_base<0UL,_JsonMap_*,_false>._M_head_impl ==
      (__uniq_ptr_impl<JsonMap,_std::default_delete<JsonMap>_>)0x0) {
    (this->m_packagePath)._M_pathname._M_dataplus._M_p = (pointer)0x0;
    (this->m_packagePath)._M_pathname._M_string_length = 0;
  }
  else {
    paVar1 = &description.field_2;
    description._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&description,"path","");
    JsonMap::getString(&author,(JsonMap *)
                               uVar3._M_t.
                               super___uniq_ptr_impl<JsonMap,_std::default_delete<JsonMap>_>._M_t.
                               super__Tuple_impl<0UL,_JsonMap_*,_std::default_delete<JsonMap>_>.
                               super__Head_base<0UL,_JsonMap_*,_false>._M_head_impl,&description);
    std::filesystem::__cxx11::path::path((path *)&name,&author,auto_format);
    std::filesystem::__cxx11::operator/(&path,(path *)&identifier[2].field_2,(path *)&name);
    std::filesystem::__cxx11::path::~path((path *)&name);
    paVar2 = &author.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)author._M_dataplus._M_p != paVar2) {
      operator_delete(author._M_dataplus._M_p,author.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)description._M_dataplus._M_p != paVar1) {
      operator_delete(description._M_dataplus._M_p,description.field_2._M_allocated_capacity + 1);
    }
    uVar3._M_t.super___uniq_ptr_impl<JsonMap,_std::default_delete<JsonMap>_>._M_t.
    super__Tuple_impl<0UL,_JsonMap_*,_std::default_delete<JsonMap>_>.
    super__Head_base<0UL,_JsonMap_*,_false>._M_head_impl =
         itemInfoEntry._M_t.super___uniq_ptr_impl<JsonMap,_std::default_delete<JsonMap>_>._M_t.
         super__Tuple_impl<0UL,_JsonMap_*,_std::default_delete<JsonMap>_>.
         super__Head_base<0UL,_JsonMap_*,_false>._M_head_impl;
    author._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&author,"name","");
    JsonMap::getString(&name,(JsonMap *)
                             uVar3._M_t.
                             super___uniq_ptr_impl<JsonMap,_std::default_delete<JsonMap>_>._M_t.
                             super__Tuple_impl<0UL,_JsonMap_*,_std::default_delete<JsonMap>_>.
                             super__Head_base<0UL,_JsonMap_*,_false>._M_head_impl,&author);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)author._M_dataplus._M_p != paVar2) {
      operator_delete(author._M_dataplus._M_p,author.field_2._M_allocated_capacity + 1);
    }
    uVar3._M_t.super___uniq_ptr_impl<JsonMap,_std::default_delete<JsonMap>_>._M_t.
    super__Tuple_impl<0UL,_JsonMap_*,_std::default_delete<JsonMap>_>.
    super__Head_base<0UL,_JsonMap_*,_false>._M_head_impl =
         itemInfoEntry._M_t.super___uniq_ptr_impl<JsonMap,_std::default_delete<JsonMap>_>._M_t.
         super__Tuple_impl<0UL,_JsonMap_*,_std::default_delete<JsonMap>_>.
         super__Head_base<0UL,_JsonMap_*,_false>._M_head_impl;
    description._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&description,"author","");
    JsonMap::getString(&author,(JsonMap *)
                               uVar3._M_t.
                               super___uniq_ptr_impl<JsonMap,_std::default_delete<JsonMap>_>._M_t.
                               super__Tuple_impl<0UL,_JsonMap_*,_std::default_delete<JsonMap>_>.
                               super__Head_base<0UL,_JsonMap_*,_false>._M_head_impl,&description);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)description._M_dataplus._M_p != paVar1) {
      operator_delete(description._M_dataplus._M_p,description.field_2._M_allocated_capacity + 1);
    }
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"description","");
    JsonMap::getString(&description,
                       (JsonMap *)
                       itemInfoEntry._M_t.
                       super___uniq_ptr_impl<JsonMap,_std::default_delete<JsonMap>_>._M_t.
                       super__Tuple_impl<0UL,_JsonMap_*,_std::default_delete<JsonMap>_>.
                       super__Head_base<0UL,_JsonMap_*,_false>._M_head_impl,&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    local_a0._M_dataplus._M_p = (pointer)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<MPL::detail::ModelPackageItemInfoImpl,std::allocator<MPL::detail::ModelPackageItemInfoImpl>,std::__cxx11::string_const&,std::filesystem::__cxx11::path&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_a0._M_string_length,
               (ModelPackageItemInfoImpl **)&local_a0,
               (allocator<MPL::detail::ModelPackageItemInfoImpl> *)&local_e9,in_RDX,&path,&name,
               &author,&description);
    (this->m_packagePath)._M_pathname._M_dataplus._M_p = (pointer)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<MPL::ModelPackageItemInfo,std::allocator<MPL::ModelPackageItemInfo>,std::shared_ptr<MPL::detail::ModelPackageItemInfoImpl>>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &(this->m_packagePath)._M_pathname._M_string_length,(ModelPackageItemInfo **)this,
               (allocator<MPL::ModelPackageItemInfo> *)&local_e9,
               (shared_ptr<MPL::detail::ModelPackageItemInfoImpl> *)&local_a0);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._M_string_length);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)description._M_dataplus._M_p != &description.field_2) {
      operator_delete(description._M_dataplus._M_p,description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)author._M_dataplus._M_p != &author.field_2) {
      operator_delete(author._M_dataplus._M_p,author.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)name._M_dataplus._M_p != &name.field_2) {
      operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
    }
    std::filesystem::__cxx11::path::~path(&path);
  }
  std::unique_ptr<JsonMap,_std::default_delete<JsonMap>_>::~unique_ptr(&itemInfoEntry);
  sVar4.super___shared_ptr<MPL::ModelPackageItemInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  sVar4.super___shared_ptr<MPL::ModelPackageItemInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<MPL::ModelPackageItemInfo>)
         sVar4.super___shared_ptr<MPL::ModelPackageItemInfo,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ModelPackageItemInfo> ModelPackageImpl::findItem(const std::string& identifier) const
{
    auto itemInfoEntry = getItemInfoEntry(identifier);
    if (itemInfoEntry == nullptr) {
        return nullptr;
    }
    
    auto path = m_packageDataDirPath / itemInfoEntry->getString(kModelPackageItemInfoPathKey);
    auto name = itemInfoEntry->getString(kModelPackageItemInfoNameKey);
    auto author = itemInfoEntry->getString(kModelPackageItemInfoAuthorKey);
    auto description = itemInfoEntry->getString(kModelPackageItemInfoDescriptionKey);
    
    return std::make_shared<ModelPackageItemInfo>(std::make_shared<ModelPackageItemInfoImpl>(identifier, path, name, author, description));
}